

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O2

void __thiscall TestEncoding::testEncoding<long>(TestEncoding *this,long start,long stop)

{
  ostream *poVar1;
  long i;
  long lVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"testing from ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1," to ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1," inclusive\n");
  for (lVar2 = 0; lVar2 <= stop - start; lVar2 = lVar2 + 1) {
    compare(this,start + lVar2);
  }
  return;
}

Assistant:

void testEncoding(IntType start, IntType stop)
    {
        std::cout << "testing from " << start << " to " << stop << " inclusive\n";
        IntType val = start;
        IntType diff = stop - start + 1;

        for(IntType i = 0; i < diff; ++i) {
            compare(val+i);
        }
    }